

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O3

bool __thiscall
ON_OffsetSurfaceFunction::SetBaseSurface(ON_OffsetSurfaceFunction *this,ON_Surface *srf)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined8 in_XMM1_Qa;
  
  this->m_srf = (ON_Surface *)0x0;
  this->m_bZeroSideDerivative[0] = false;
  this->m_bZeroSideDerivative[1] = false;
  this->m_bZeroSideDerivative[2] = false;
  this->m_bZeroSideDerivative[3] = false;
  uVar1 = CONCAT44(ON_Interval::EmptyInterval.m_t[1]._4_4_,ON_Interval::EmptyInterval.m_t[1]._0_4_);
  *(ulong *)&this->field_0x8 =
       CONCAT44(ON_Interval::EmptyInterval.m_t[0]._4_4_,ON_Interval::EmptyInterval.m_t[0]._0_4_);
  *(undefined8 *)&this->field_0x10 = uVar1;
  uVar4 = ON_Interval::EmptyInterval.m_t[1]._4_4_;
  uVar3 = ON_Interval::EmptyInterval.m_t[1]._0_4_;
  uVar2 = ON_Interval::EmptyInterval.m_t[0]._4_4_;
  *(undefined4 *)&this->field_0x18 = ON_Interval::EmptyInterval.m_t[0]._0_4_;
  *(undefined4 *)&this->field_0x1c = uVar2;
  *(undefined4 *)&this->field_0x20 = uVar3;
  *(undefined4 *)&this->field_0x24 = uVar4;
  if (-1 < (this->m_bumps).m_capacity) {
    (this->m_bumps).m_count = 0;
  }
  this->m_bValid = false;
  this->m_srf = srf;
  if (srf != (ON_Surface *)0x0) {
    (*(srf->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(srf,0);
    *(ulong *)&this->field_0x8 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    *(undefined8 *)&this->field_0x10 = in_XMM1_Qa;
    (*(this->m_srf->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this->m_srf,1);
    *(ulong *)&this->field_0x18 = CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
    *(undefined8 *)&this->field_0x20 = in_XMM1_Qa;
    bVar5 = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0x8);
    if ((bVar5) && (bVar5 = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0x18), bVar5)) {
      return true;
    }
    this->m_srf = (ON_Surface *)0x0;
    this->m_bZeroSideDerivative[0] = false;
    this->m_bZeroSideDerivative[1] = false;
    this->m_bZeroSideDerivative[2] = false;
    this->m_bZeroSideDerivative[3] = false;
    uVar1 = CONCAT44(ON_Interval::EmptyInterval.m_t[1]._4_4_,ON_Interval::EmptyInterval.m_t[1]._0_4_
                    );
    *(ulong *)&this->field_0x8 =
         CONCAT44(ON_Interval::EmptyInterval.m_t[0]._4_4_,ON_Interval::EmptyInterval.m_t[0]._0_4_);
    *(undefined8 *)&this->field_0x10 = uVar1;
    uVar1 = CONCAT44(ON_Interval::EmptyInterval.m_t[1]._4_4_,ON_Interval::EmptyInterval.m_t[1]._0_4_
                    );
    *(ulong *)&this->field_0x18 =
         CONCAT44(ON_Interval::EmptyInterval.m_t[0]._4_4_,ON_Interval::EmptyInterval.m_t[0]._0_4_);
    *(undefined8 *)&this->field_0x20 = uVar1;
    if (-1 < (this->m_bumps).m_capacity) {
      (this->m_bumps).m_count = 0;
    }
    this->m_bValid = false;
  }
  return false;
}

Assistant:

bool ON_OffsetSurfaceFunction::SetBaseSurface( const ON_Surface* srf )
{
  bool rc = false;
  Destroy();
  m_srf = srf;
  if ( 0 != m_srf )
  {
    m_domain[0] = m_srf->Domain(0);
    m_domain[1] = m_srf->Domain(1);
    rc = m_domain[0].IsIncreasing() && m_domain[1].IsIncreasing();
    if ( !rc )
      Destroy();
  }
  return rc;
}